

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

Validity * __thiscall
capnp::compiler::CompilerMain::evalConst
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr name)

{
  RawSchema *pRVar1;
  PointerReader reader;
  Reader brand;
  undefined1 auVar2 [40];
  Reader reader_00;
  Field field;
  Reader value_00;
  Reader value_01;
  StringPtr name_00;
  Tuple<kj::String,_kj::Array<unsigned_long>_> *pTVar3;
  size_t sVar4;
  Format FVar5;
  int iVar6;
  long lVar7;
  ConstSchema constant;
  StructSchema SVar8;
  SegmentReader *pSVar9;
  Arena *pAVar10;
  Reader *extraout_RDX;
  Reader *extraout_RDX_00;
  Reader *extraout_RDX_01;
  Reader *extraout_RDX_02;
  Reader *params;
  Reader *extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  ProcessContext *pPVar11;
  Schema SVar12;
  char *pcVar13;
  SegmentReader *pSVar14;
  undefined8 uVar15;
  bool bVar16;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ReaderOptions options;
  StringPtr SVar17;
  ReaderFor<capnp::DynamicStruct> structValue_1;
  Schema schema;
  StringPtr partName;
  Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> nameParts;
  ReaderFor<capnp::DynamicList> listValue;
  Reader value;
  ReaderFor<capnp::DynamicStruct> structValue;
  IteratorInput<char,_const_char_*> input;
  word zeroWord [1];
  SegmentArrayMessageReader emptyMessage;
  ArrayPtr<const_capnp::word> segments [1];
  Fault f;
  undefined8 params_4;
  Schema local_408;
  undefined8 in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  undefined8 in_stack_fffffffffffffc20;
  undefined8 in_stack_fffffffffffffc28;
  undefined8 in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  Schema local_3c0;
  SegmentReader *local_3b8;
  ArrayDisposer *local_3b0;
  Arena *local_3a8;
  size_t local_3a0;
  Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> local_398;
  ReaderFor<DynamicList> local_378;
  Reader local_330;
  ReaderFor<DynamicStruct> local_2e8;
  Validity *local_2b0;
  IteratorInput<char,_const_char_*> local_2a8;
  StructSchema local_288;
  SegmentReader *local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 uStack_230;
  word local_208;
  ReaderFor<DynamicStruct> local_200;
  ReaderFor<DynamicList> local_1c8;
  undefined1 local_188 [24];
  Maybe<kj::_::Mutex::Waiter_&> *local_170;
  bool local_168;
  ArrayPtr<const_capnp::word> local_a8;
  Sequence_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>,_const_kj::parse::EndOfInput__&>
  local_90;
  char (*params_2) [19];
  
  local_2a8.pos = name.content.ptr;
  if (this->flat == true) {
    FVar5 = this->packed | FLAT;
  }
  else {
    FVar5 = PACKED;
    if (this->packed == false) {
      FVar5 = BINARY;
      if (this->binary == false) {
        FVar5 = this->convertTo;
      }
    }
  }
  this->convertTo = FVar5;
  lVar7 = (long)(this->sourceFiles).builder.pos - (long)(this->sourceFiles).builder.ptr;
  local_188._0_8_ = (lVar7 >> 3) * 0x6db6db6db6db6db7;
  local_188._8_4_ = 1;
  local_188._16_8_ = " == ";
  local_170 = (Maybe<kj::_::Mutex::Waiter_&> *)0x5;
  local_168 = lVar7 == 0x38;
  if (!local_168) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              ((Fault *)&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
               ,0x693,FAILED,"sourceFiles.size() == 1","_kjCondition,",
               (DebugComparison<unsigned_long,_int> *)local_188);
    kj::_::Debug::Fault::fatal((Fault *)&local_90);
  }
  local_90.first.subParser.first =
       (Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>
        *)kj::parse::identifier;
  local_90.first.subParser.rest.first.subParser.rest.first =
       (Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>
        *)kj::parse::integer;
  local_90.first.subParser.rest.rest.first.first = (EndOfInput_ *)&kj::parse::endOfInput;
  local_90.first.subParser.rest.rest.first.rest.first.rest.first.subParser =
       (EndOfInput_ *)&kj::parse::endOfInput;
  local_90.rest.first = (EndOfInput_ *)&kj::parse::endOfInput;
  local_2a8.end = local_2a8.pos + (name.content.size_ - 1);
  local_2a8.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_398.disposer = (ArrayDisposer *)0x0;
  local_398.ptr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
  local_398.size_ = 0;
  local_2a8.best = local_2a8.pos;
  kj::parse::
  Sequence_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'['>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::ExactlyConst_<char,_'x'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,_']'>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'.'>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>,_const_kj::parse::EndOfInput__&>
  ::parseNext<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *)&local_330,
             &local_90,&local_2a8);
  local_188[0] = (undefined1)local_330.type;
  if ((undefined1)local_330.type == UNKNOWN) {
    kj::heapString((String *)&local_330,"invalid syntax",0xe);
    (__return_storage_ptr__->errorMessage).ptr.isSet = true;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
         (char *)CONCAT44(local_330._4_4_,local_330.type);
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ =
         local_330.field_1.intValue;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
         (ArrayDisposer *)local_330.field_1.textValue.super_StringPtr.content.size_;
    goto LAB_00123fac;
  }
  local_398.ptr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)local_330.field_1.intValue;
  local_398.size_ = local_330.field_1.textValue.super_StringPtr.content.size_;
  local_398.disposer = (ArrayDisposer *)local_330.field_1.listValue.reader.segment;
  pcVar13 = (char *)((this->sourceFiles).builder.ptr)->id;
  local_3b8 = (SegmentReader *)local_330.field_1.intValue;
  local_3b0 = (ArrayDisposer *)local_330.field_1.textValue.super_StringPtr.content.size_;
  uVar15 = local_330.field_1.intValue;
  local_2b0 = __return_storage_ptr__;
  if (local_330.field_1._8_8_ == (ArrayDisposer *)0x0) {
LAB_0012391d:
    bVar16 = false;
  }
  else {
    lVar7 = local_330.field_1.textValue.super_StringPtr.content.size_ * 0x30;
    do {
      pAVar10 = (Arena *)0x229f1b;
      if (*(long *)&((SegmentReader *)uVar15)->id != 0) {
        pAVar10 = ((SegmentReader *)uVar15)->arena;
      }
      SVar17.content.size_ = (size_t)pAVar10;
      SVar17.content.ptr = pcVar13;
      Compiler::lookup((Compiler *)local_188,(uint64_t)(this->compiler).ptr,SVar17);
      if (local_188[0] != '\x01') goto LAB_0012391d;
      pcVar13 = (char *)CONCAT44(local_188._12_4_,local_188._8_4_);
      bVar16 = ((SegmentReader *)uVar15)->readLimiter != (ReadLimiter *)0x0;
      if (bVar16) break;
      uVar15 = &((SegmentReader *)(uVar15 + 0x28))->id;
      lVar7 = lVar7 + -0x30;
    } while (lVar7 != 0);
  }
  local_258 = 0;
  local_268 = 0;
  uStack_260 = 0;
  local_278 = 0;
  uStack_270 = 0;
  uStack_250 = 0x7fffffff;
  SVar12.raw = (RawBrandedSchema *)0x0;
  auVar2 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar2._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar2._8_8_;
  brand._reader.data = (void *)auVar2._16_8_;
  brand._reader.pointers = (WirePointer *)auVar2._24_8_;
  brand._reader.dataSize = auVar2._32_4_;
  brand._reader.pointerCount = auVar2._36_2_;
  brand._reader._38_2_ = auVar2._38_2_;
  local_3c0 = SchemaLoader::get(&((this->compiler).ptr)->loader,(uint64_t)pcVar13,brand,
                                (Schema)0x27f800);
  __return_storage_ptr__ = local_2b0;
  local_330.type = UNKNOWN;
  local_a8.ptr = &local_208;
  local_208.content = 0;
  local_a8.size_ = 1;
  segments_00.size_ = 1;
  segments_00.ptr = &local_a8;
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  params_2 = (char (*) [19])0x40;
  SegmentArrayMessageReader::SegmentArrayMessageReader
            ((SegmentArrayMessageReader *)local_188,segments_00,options);
  Schema::getProto((Reader *)&local_408,&local_3c0);
  if ((uint)in_stack_fffffffffffffc18 < 0x70) {
LAB_00123a53:
    if (bVar16) {
      SVar17 = Schema::getShortDisplayName(&local_3c0);
      local_378.schema.elementType._0_7_ = SVar17.content.ptr._0_7_;
      local_378.schema.elementType._7_1_ = SVar17.content.ptr._7_1_;
      local_378.schema.elementType.field_4.scopeId._0_7_ = SVar17.content.size_._0_7_;
      local_378.schema.elementType.field_4.scopeId._7_1_ = SVar17.content.size_._7_1_;
      kj::str<char_const(&)[2],kj::StringPtr,char_const(&)[17]>
                ((String *)&local_408,(kj *)0x2143f4,(char (*) [2])&local_378,(StringPtr *)0x203bbf,
                 (char (*) [17])&local_378);
    }
    else if ((SegmentReader *)uVar15 == (SegmentReader *)((long)local_3b8 + (long)local_3b0 * 0x30))
    {
      SVar17 = Schema::getShortDisplayName(&local_3c0);
      local_378.schema.elementType._0_7_ = SVar17.content.ptr._0_7_;
      local_378.schema.elementType._7_1_ = SVar17.content.ptr._7_1_;
      local_378.schema.elementType.field_4.scopeId._0_7_ = SVar17.content.size_._0_7_;
      local_378.schema.elementType.field_4.scopeId._7_1_ = SVar17.content.size_._7_1_;
      kj::str<char_const(&)[2],kj::StringPtr,char_const(&)[23]>
                ((String *)&local_408,(kj *)0x2143f4,(char (*) [2])&local_378,
                 (StringPtr *)"\' cannot be evaluated.",(char (*) [23])&local_378);
    }
    else {
      kj::str<char_const(&)[2],kj::String&,char_const(&)[18]>
                ((String *)&local_408,(kj *)0x2143f4,(char (*) [2])uVar15,
                 (String *)"\' is not defined.",(char (*) [18])params_2);
    }
  }
  else {
    if (*(short *)(in_stack_fffffffffffffc08 + 0xc) != 1) {
      if (*(short *)(in_stack_fffffffffffffc08 + 0xc) != 4) goto LAB_00123a53;
      constant = Schema::asConst(&local_3c0);
      DynamicValue::Reader::Reader((Reader *)&local_408,constant);
      DynamicValue::Reader::operator=(&local_330,(Reader *)&local_408);
      DynamicValue::Reader::~Reader((Reader *)&local_408);
      params = extraout_RDX;
LAB_00123b98:
      local_3b8 = (SegmentReader *)((long)local_3b8 + (long)local_3b0 * 0x30);
      if ((SegmentReader *)uVar15 != local_3b8) {
        do {
          local_3a8 = (Arena *)0x229f1b;
          lVar7 = *(long *)&((SegmentReader *)uVar15)->id;
          if (lVar7 != 0) {
            local_3a8 = ((SegmentReader *)uVar15)->arena;
          }
          local_3a0 = lVar7 + (ulong)(lVar7 == 0);
          params_4 = SVar12.raw;
          if (!bVar16) {
            if (local_330.type != STRUCT) {
              kj::str<char_const(&)[2],kj::String&,char_const(&)[19]>
                        ((String *)&local_408,(kj *)0x2143f4,
                         (char (*) [2])&((SegmentReader *)(uVar15 + -0x50))->readLimiter,
                         (String *)"\' is not a struct.",params_2);
              goto LAB_00123f37;
            }
            DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                      (&local_2e8,&local_330);
            local_288.super_Schema.raw = local_2e8.schema.super_Schema.raw;
            name_00.content.size_ = local_3a0;
            name_00.content.ptr = (char *)local_3a8;
            params_4 = in_stack_fffffffffffffc00;
            StructSchema::findFieldByName
                      ((Maybe<capnp::StructSchema::Field> *)&local_408,&local_288,name_00);
            if (local_408.raw._0_1_ != VOID) {
              kj::
              str<char_const(&)[2],kj::String&,char_const(&)[18],kj::StringPtr&,char_const(&)[3]>
                        ((String *)&local_408,(kj *)0x2143f4,
                         (char (*) [2])&((SegmentReader *)(uVar15 + -0x50))->readLimiter,
                         (String *)"\' has no member \'",(char (*) [18])&local_3a8,
                         (StringPtr *)0x20d1d3,(char (*) [3])SVar12.raw);
              in_stack_fffffffffffffc00 = params_4;
              goto LAB_00123f37;
            }
            local_378.reader._39_1_ = SUB81(in_stack_fffffffffffffc30,0);
            local_378.reader._40_7_ = SUB87((ulong)in_stack_fffffffffffffc30 >> 8,0);
            local_378.reader.ptr._7_1_ = (undefined1)in_stack_fffffffffffffc20;
            local_378.reader.elementCount =
                 (ListElementCount)((ulong)in_stack_fffffffffffffc20 >> 8);
            local_378.reader.step._0_3_ = (undefined3)((ulong)in_stack_fffffffffffffc20 >> 0x28);
            local_378.reader.step._3_1_ = (undefined1)in_stack_fffffffffffffc28;
            local_378.reader._32_7_ = SUB87((ulong)in_stack_fffffffffffffc28 >> 8,0);
            local_378.reader.segment._7_1_ = (undefined1)in_stack_fffffffffffffc10;
            local_378.reader.capTable._0_7_ = (undefined7)((ulong)in_stack_fffffffffffffc10 >> 8);
            local_378.reader.capTable._7_1_ = (undefined1)in_stack_fffffffffffffc18;
            local_378.reader.ptr._0_7_ =
                 (undefined7)(CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18) >> 8);
            local_378.schema.elementType._7_1_ = SUB81(params_4,0);
            local_378.schema.elementType.field_4.scopeId._0_7_ = (undefined7)((ulong)params_4 >> 8);
            local_378.schema.elementType.field_4.scopeId._7_1_ =
                 (undefined1)in_stack_fffffffffffffc08;
            local_378.reader.segment._0_7_ = (undefined7)((ulong)in_stack_fffffffffffffc08 >> 8);
            uStack_230 = CONCAT71(local_378.reader.ptr._0_7_,local_378.reader.capTable._7_1_);
            field._8_8_ = in_stack_fffffffffffffc08;
            field.parent.super_Schema.raw = (Schema)(Schema)params_4;
            field.proto._reader.segment = (SegmentReader *)in_stack_fffffffffffffc10;
            field.proto._reader.capTable = (CapTableReader *)uStack_230;
            field.proto._reader.data = (void *)in_stack_fffffffffffffc20;
            field.proto._reader.pointers = (WirePointer *)in_stack_fffffffffffffc28;
            field.proto._reader.dataSize = (int)in_stack_fffffffffffffc30;
            field.proto._reader.pointerCount = (short)((ulong)in_stack_fffffffffffffc30 >> 0x20);
            field.proto._reader._38_2_ = (short)((ulong)in_stack_fffffffffffffc30 >> 0x30);
            field.proto._reader._40_8_ = in_stack_fffffffffffffc38;
            in_stack_fffffffffffffc00 = params_4;
            DynamicStruct::Reader::get((Reader *)&local_408,&local_2e8,field);
            DynamicValue::Reader::operator=(&local_330,(Reader *)&local_408);
            DynamicValue::Reader::~Reader((Reader *)&local_408);
            params = extraout_RDX_01;
          }
          if (((SegmentReader *)uVar15)->readLimiter != (ReadLimiter *)0x0) {
            pSVar9 = (SegmentReader *)0x0;
            pSVar14 = (SegmentReader *)0x1;
            do {
              SVar12.raw = (RawBrandedSchema *)(((SegmentReader *)uVar15)->ptr).size_;
              if (local_330.type != LIST) {
                if ((int)pSVar14 != 1) {
                  local_2e8.schema.super_Schema.raw = (Schema)(Schema)SVar12.raw;
                  local_2e8.reader.segment = pSVar9;
                  kj::strArray<kj::ArrayPtr<unsigned_long>>
                            ((String *)&local_378,(kj *)&local_2e8,(ArrayPtr<unsigned_long> *)"][",
                             (char *)SVar12.raw);
                  kj::
                  str<char_const(&)[2],kj::StringPtr&,char_const(&)[2],kj::String,char_const(&)[18]>
                            ((String *)&local_408,(kj *)0x2143f4,(char (*) [2])&local_3a8,
                             (StringPtr *)0x203ba7,(char (*) [2])&local_378,
                             (String *)"]\' is not a list.",(char (*) [18])params_4);
                  (__return_storage_ptr__->errorMessage).ptr.isSet = true;
                  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
                       (char *)local_408.raw;
                  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ =
                       in_stack_fffffffffffffc00;
                  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
                       (ArrayDisposer *)in_stack_fffffffffffffc08;
                  local_408.raw = (RawBrandedSchema *)0x0;
                  lVar7 = CONCAT17(local_378.schema.elementType._7_1_,
                                   local_378.schema.elementType._0_7_);
                  if (lVar7 != 0) {
                    uVar15 = CONCAT17(local_378.schema.elementType.field_4.scopeId._7_1_,
                                      local_378.schema.elementType.field_4.scopeId._0_7_);
                    local_378.schema.elementType.baseType = VOID;
                    local_378.schema.elementType.listDepth = '\0';
                    local_378.schema.elementType.isImplicitParam = false;
                    local_378.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
                    local_378.schema.elementType._6_1_ = 0;
                    local_378.schema.elementType._7_1_ = 0;
                    local_378.schema.elementType.field_4.scopeId._0_7_ = 0;
                    local_378.schema.elementType.field_4.scopeId._7_1_ = 0;
                    (*(code *)**(undefined8 **)
                                CONCAT17(local_378.reader.segment._7_1_,
                                         local_378.reader.segment._0_7_))
                              ((undefined8 *)
                               CONCAT17(local_378.reader.segment._7_1_,
                                        local_378.reader.segment._0_7_),lVar7,1,uVar15,uVar15,0);
                  }
                  goto LAB_00123f56;
                }
                kj::str<char_const(&)[2],kj::StringPtr&,char_const(&)[17]>
                          ((String *)&local_408,(kj *)0x2143f4,(char (*) [2])&local_3a8,
                           (StringPtr *)0x203bbf,(char (*) [17])params_2);
                goto LAB_00123f37;
              }
              pRVar1 = (&(SVar12.raw)->generic)[(long)pSVar9];
              DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
                        (&local_378,&local_330);
              if ((RawSchema *)(ulong)local_378.reader.elementCount <= pRVar1) {
                local_288.super_Schema.raw = (Schema)(((SegmentReader *)uVar15)->ptr).size_;
                local_280 = pSVar14;
                kj::strArray<kj::ArrayPtr<unsigned_long>>
                          ((String *)&local_2e8,(kj *)&local_288,(ArrayPtr<unsigned_long> *)"][",
                           (char *)local_288.super_Schema.raw);
                kj::
                str<char_const(&)[2],kj::StringPtr&,char_const(&)[2],kj::String,char_const(&)[21]>
                          ((String *)&local_408,(kj *)0x2143f4,(char (*) [2])&local_3a8,
                           (StringPtr *)0x203ba7,(char (*) [2])&local_2e8,
                           (String *)"]\' is out-of-bounds.",(char (*) [21])params_4);
                pSVar9 = local_2e8.reader.segment;
                SVar8.super_Schema.raw = (Schema)(Schema)local_2e8.schema;
                (__return_storage_ptr__->errorMessage).ptr.isSet = true;
                (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
                     (char *)local_408.raw;
                (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ =
                     in_stack_fffffffffffffc00;
                (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
                     (ArrayDisposer *)in_stack_fffffffffffffc08;
                local_408.raw = (RawBrandedSchema *)0x0;
                if (local_2e8.schema.super_Schema.raw != (RawBrandedSchema *)0x0) {
                  local_2e8.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x0;
                  local_2e8.reader.segment = (SegmentReader *)0x0;
                  (**(local_2e8.reader.capTable)->_vptr_CapTableReader)
                            (local_2e8.reader.capTable,SVar8.super_Schema.raw,1,pSVar9,pSVar9,0);
                }
                goto LAB_00123f56;
              }
              DynamicList::Reader::operator[]((Reader *)&local_408,&local_378,(uint)pRVar1);
              DynamicValue::Reader::operator=(&local_330,(Reader *)&local_408);
              DynamicValue::Reader::~Reader((Reader *)&local_408);
              bVar16 = pSVar14 < (SegmentReader *)((SegmentReader *)uVar15)->readLimiter;
              pSVar9 = pSVar14;
              params = extraout_RDX_02;
              pSVar14 = (SegmentReader *)(ulong)((int)pSVar14 + 1);
            } while (bVar16);
          }
          uVar15 = &((SegmentReader *)(uVar15 + 0x28))->id;
          bVar16 = false;
          SVar12.raw = (RawBrandedSchema *)params_4;
        } while ((SegmentReader *)uVar15 != local_3b8);
      }
      if (this->convertTo == TEXT) {
        if (this->pretty != true) goto LAB_00124270;
        if (local_330.type != LIST) {
          if (local_330.type != STRUCT) goto LAB_00124270;
          pPVar11 = this->context;
          DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                    (&local_200,&local_330);
          value_00.reader.segment = (SegmentReader *)in_stack_fffffffffffffc08;
          value_00.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffc00;
          value_00.reader.capTable = (CapTableReader *)in_stack_fffffffffffffc10;
          value_00.reader.data._0_4_ = in_stack_fffffffffffffc18;
          value_00.reader.data._4_4_ = in_stack_fffffffffffffc1c;
          value_00.reader.pointers = (WirePointer *)in_stack_fffffffffffffc20;
          value_00.reader.dataSize = (int)in_stack_fffffffffffffc28;
          value_00.reader.pointerCount = (short)((ulong)in_stack_fffffffffffffc28 >> 0x20);
          value_00.reader._38_2_ = (short)((ulong)in_stack_fffffffffffffc28 >> 0x30);
          value_00.reader._40_8_ = in_stack_fffffffffffffc30;
          prettyPrint(value_00);
          kj::StringTree::flatten((String *)&local_378,(StringTree *)&local_408);
          lVar7 = CONCAT17(local_378.schema.elementType.field_4.scopeId._7_1_,
                           local_378.schema.elementType.field_4.scopeId._0_7_);
          if (lVar7 == 0) goto LAB_0012433f;
          pcVar13 = (char *)CONCAT17(local_378.schema.elementType._7_1_,
                                     local_378.schema.elementType._0_7_);
          goto LAB_00124346;
        }
        pPVar11 = this->context;
        DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
                  (&local_1c8,&local_330);
        value_01.schema.elementType.field_4.schema = (RawBrandedSchema *)in_stack_fffffffffffffc08;
        value_01.schema.elementType.baseType = (short)in_stack_fffffffffffffc00;
        value_01.schema.elementType.listDepth = (char)((ulong)in_stack_fffffffffffffc00 >> 0x10);
        value_01.schema.elementType.isImplicitParam =
             (bool)(char)((ulong)in_stack_fffffffffffffc00 >> 0x18);
        value_01.schema.elementType.field_3 =
             (anon_union_2_2_d12d5221_for_Type_3)(short)((ulong)in_stack_fffffffffffffc00 >> 0x20);
        value_01.schema.elementType._6_2_ = (short)((ulong)in_stack_fffffffffffffc00 >> 0x30);
        value_01.reader.segment = (SegmentReader *)in_stack_fffffffffffffc10;
        value_01.reader.capTable._0_4_ = in_stack_fffffffffffffc18;
        value_01.reader.capTable._4_4_ = in_stack_fffffffffffffc1c;
        value_01.reader.ptr = (byte *)in_stack_fffffffffffffc20;
        value_01.reader.elementCount = (int)in_stack_fffffffffffffc28;
        value_01.reader.step = (int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
        value_01.reader.structDataSize = (int)in_stack_fffffffffffffc30;
        value_01.reader.structPointerCount = (short)((ulong)in_stack_fffffffffffffc30 >> 0x20);
        value_01.reader.elementSize = (char)((ulong)in_stack_fffffffffffffc30 >> 0x30);
        value_01.reader._39_1_ = (char)((ulong)in_stack_fffffffffffffc30 >> 0x38);
        value_01.reader._40_8_ = in_stack_fffffffffffffc38;
        prettyPrint(value_01);
        kj::StringTree::flatten((String *)&local_378,(StringTree *)&local_408);
        lVar7 = CONCAT17(local_378.schema.elementType.field_4.scopeId._7_1_,
                         local_378.schema.elementType.field_4.scopeId._0_7_);
        if (lVar7 != 0) {
          pcVar13 = (char *)CONCAT17(local_378.schema.elementType._7_1_,
                                     local_378.schema.elementType._0_7_);
          goto LAB_0012435e;
        }
      }
      else {
        if (local_330.type != STRUCT) {
          kj::heapString((String *)&local_408,
                         "not a struct; binary output is only available on structs",0x38);
          goto LAB_00123f37;
        }
        DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                  ((ReaderFor<DynamicStruct> *)&local_408,&local_330);
        (this->rootType).super_Schema.raw = local_408.raw;
        local_378.schema.elementType.baseType = 0x5b0;
        local_378.schema.elementType.listDepth = '(';
        local_378.schema.elementType.isImplicitParam = false;
        local_378.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
        local_378.schema.elementType._6_1_ = 0;
        local_378.schema.elementType._7_1_ = 0;
        local_378.schema.elementType.field_4.scopeId._0_7_ = 0xffffff00000001;
        local_378.schema.elementType.field_4.scopeId._7_1_ = 0xff;
        reader_00._reader.pointers._4_4_ = in_stack_fffffffffffffc1c;
        reader_00._reader.pointers._0_4_ = in_stack_fffffffffffffc18;
        reader_00._reader.capTable = (CapTableReader *)in_stack_fffffffffffffc08;
        reader_00._reader.segment = (SegmentReader *)in_stack_fffffffffffffc00;
        reader_00._reader.data = (void *)in_stack_fffffffffffffc10;
        reader_00._reader._32_8_ = in_stack_fffffffffffffc20;
        reader_00._reader._40_8_ = in_stack_fffffffffffffc28;
        writeConversion(this,reader_00,(OutputStream *)&local_378);
        (*this->context->_vptr_ProcessContext[1])();
        params = extraout_RDX_03;
LAB_00124270:
        pPVar11 = this->context;
        kj::str<capnp::DynamicValue::Reader&>((String *)&local_408,(kj *)&local_330,params);
        SVar12.raw = local_408.raw;
        if ((CapTableReader *)in_stack_fffffffffffffc00 == (CapTableReader *)0x0) {
          SVar12.raw = (RawBrandedSchema *)0x229f1b;
        }
        (*pPVar11->_vptr_ProcessContext[5])
                  (pPVar11,SVar12.raw,
                   (char *)(in_stack_fffffffffffffc00 +
                           (ulong)((CapTableReader *)in_stack_fffffffffffffc00 ==
                                  (CapTableReader *)0x0)));
        lVar7 = extraout_RDX_04;
LAB_0012433f:
        pcVar13 = "";
LAB_00124346:
        (*pPVar11->_vptr_ProcessContext[5])(pPVar11,pcVar13,lVar7 + (ulong)(lVar7 == 0));
        lVar7 = extraout_RDX_05;
      }
      pcVar13 = "";
LAB_0012435e:
      iVar6 = (*pPVar11->_vptr_ProcessContext[5])(pPVar11,pcVar13,lVar7 + (ulong)(lVar7 == 0));
      kj::String::~String((String *)&local_378);
      kj::StringTree::~StringTree((StringTree *)&local_408);
      SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_188);
      DynamicValue::Reader::~Reader(&local_330);
      kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::~Array(&local_398);
      if (local_2a8.parent != (IteratorInput<char,_const_char_*> *)0x0) {
        pcVar13 = local_2a8.best;
        if (local_2a8.best < local_2a8.pos) {
          pcVar13 = local_2a8.pos;
        }
        if (pcVar13 <= (local_2a8.parent)->best) {
          pcVar13 = (local_2a8.parent)->best;
        }
        (local_2a8.parent)->best = pcVar13;
      }
      _Unwind_Resume(iVar6);
    }
    if ((SegmentReader *)uVar15 != (SegmentReader *)((long)local_3b0 * 0x30 + (long)local_3b8)) {
      SVar8 = Schema::asStruct(&local_3c0);
      MessageReader::getRootInternal((Reader *)&local_2e8,(MessageReader *)local_188);
      reader.capTable = (CapTableReader *)local_2e8.reader.segment;
      reader.segment = (SegmentReader *)local_2e8.schema.super_Schema.raw;
      reader.pointer = (WirePointer *)local_2e8.reader.capTable;
      reader._24_8_ = local_2e8.reader.data;
      SVar12 = local_2e8.schema.super_Schema.raw;
      capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                ((Reader *)&local_378,reader,SVar8);
      local_408.raw._0_4_ = 10;
      in_stack_fffffffffffffc00 =
           CONCAT17(local_378.schema.elementType._7_1_,local_378.schema.elementType._0_7_);
      in_stack_fffffffffffffc08 =
           CONCAT17(local_378.schema.elementType.field_4.scopeId._7_1_,
                    local_378.schema.elementType.field_4.scopeId._0_7_);
      in_stack_fffffffffffffc10._7_1_ = local_378.reader.segment._7_1_;
      in_stack_fffffffffffffc10._0_7_ = local_378.reader.segment._0_7_;
      in_stack_fffffffffffffc20 = CONCAT17(local_378.reader.ptr._7_1_,local_378.reader.ptr._0_7_);
      in_stack_fffffffffffffc28 = CONCAT44(local_378.reader.step,local_378.reader.elementCount);
      in_stack_fffffffffffffc18 = (undefined4)local_378.reader.capTable._0_7_;
      in_stack_fffffffffffffc1c =
           (undefined4)
           (CONCAT17(local_378.reader.capTable._7_1_,local_378.reader.capTable._0_7_) >> 0x20);
      in_stack_fffffffffffffc30 = CONCAT17(local_378.reader._39_1_,local_378.reader._32_7_);
      DynamicValue::Reader::operator=(&local_330,(Reader *)&local_408);
      DynamicValue::Reader::~Reader((Reader *)&local_408);
      params = extraout_RDX_00;
      goto LAB_00123b98;
    }
    SVar17 = Schema::getShortDisplayName(&local_3c0);
    local_378.schema.elementType._0_7_ = SVar17.content.ptr._0_7_;
    local_378.schema.elementType._7_1_ = SVar17.content.ptr._7_1_;
    local_378.schema.elementType.field_4.scopeId._0_7_ = SVar17.content.size_._0_7_;
    local_378.schema.elementType.field_4.scopeId._7_1_ = SVar17.content.size_._7_1_;
    kj::str<char_const(&)[2],kj::StringPtr,char_const(&)[23]>
              ((String *)&local_408,(kj *)0x2143f4,(char (*) [2])&local_378,
               (StringPtr *)"\' cannot be evaluated.",(char (*) [23])&local_378);
  }
LAB_00123f37:
  (__return_storage_ptr__->errorMessage).ptr.isSet = true;
  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr = (char *)local_408.raw;
  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ = in_stack_fffffffffffffc00
  ;
  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
       (ArrayDisposer *)in_stack_fffffffffffffc08;
LAB_00123f56:
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_188);
  DynamicValue::Reader::~Reader(&local_330);
  sVar4 = local_398.size_;
  pTVar3 = local_398.ptr;
  if ((SegmentReader *)local_398.ptr != (SegmentReader *)0x0) {
    local_398.ptr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
    local_398.size_ = 0;
    (*(code *)((Arena *)(local_398.disposer)->_vptr_ArrayDisposer)->_vptr_Arena)
              (local_398.disposer,pTVar3,0x30,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::
               destruct);
  }
LAB_00123fac:
  if (local_2a8.parent != (IteratorInput<char,_const_char_*> *)0x0) {
    if (local_2a8.best < local_2a8.pos) {
      local_2a8.best = local_2a8.pos;
    }
    if (local_2a8.best <= (local_2a8.parent)->best) {
      local_2a8.best = (local_2a8.parent)->best;
    }
    (local_2a8.parent)->best = local_2a8.best;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity evalConst(kj::StringPtr name) {
    convertTo = formatFromDeprecatedFlags(convertTo);

    KJ_ASSERT(sourceFiles.size() == 1);

    auto parser = kj::parse::sequence(
        kj::parse::many(
            kj::parse::sequence(
                kj::parse::identifier,
                kj::parse::many(
                    kj::parse::sequence(
                        kj::parse::exactChar<'['>(),
                        kj::parse::integer,
                        kj::parse::exactChar<']'>())),
                kj::parse::oneOf(
                    kj::parse::endOfInput,
                    kj::parse::sequence(
                        kj::parse::exactChar<'.'>(),
                        kj::parse::notLookingAt(kj::parse::endOfInput))))),
        kj::parse::endOfInput);

    kj::parse::IteratorInput<char, const char*> input(name.begin(), name.end());

    kj::Array<kj::Tuple<kj::String, kj::Array<uint64_t>>> nameParts;
    KJ_IF_SOME(p, parser(input)) {
      nameParts = kj::mv(p);
    } else {
      return "invalid syntax";
    }